

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::CheckInvariants(LinearScan *this)

{
  BVUnitT<unsigned_long> *this_00;
  undefined8 *puVar1;
  StackSym *this_01;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BVIndex BVar6;
  undefined4 *puVar7;
  Type *ppLVar8;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  Type pLVar10;
  ushort uVar11;
  uint32 uVar12;
  int iVar13;
  BitVector BVar14;
  int i;
  int iVar15;
  ulong uVar16;
  uint index;
  BVUnitT<unsigned_long> local_50;
  BitVector bv;
  BVUnitT<unsigned_long> local_40;
  BitVector _unit;
  
  local_50.word = (this->nonAllocatableRegs).word;
  BVar14.word = (Type)this->activeLiveranges;
  bv.word = (Type)this;
  local_40.word = BVar14.word;
  _unit.word = BVar14.word;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar12 = 0;
  while( true ) {
    if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)BVar14.word ==
        (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_005311fb;
      *puVar7 = 0;
      BVar14 = _unit;
    }
    pSVar9 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)BVar14.word)->
             super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (pSVar9 == (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word) break;
    _unit.word = (Type)pSVar9;
    ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    BVar5 = BVUnitT<unsigned_long>::Test(&local_50,(uint)(*ppLVar8)->reg);
    if (BVar5 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16a,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
      if (!bVar4) goto LAB_005311fb;
      *puVar7 = 0;
    }
    BVUnitT<unsigned_long>::Set(&local_50,(uint)(*ppLVar8)->reg);
    pLVar10 = *ppLVar8;
    uVar11 = *(ushort *)&pLVar10->field_0x9c;
    if ((uVar11 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16c,"(!lifetime->isOpHelperSpilled)","!lifetime->isOpHelperSpilled");
      if (!bVar4) goto LAB_005311fb;
      *puVar7 = 0;
      pLVar10 = *ppLVar8;
      uVar11 = *(ushort *)&pLVar10->field_0x9c;
    }
    if ((uVar11 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16d,"(!lifetime->isSpilled)","!lifetime->isSpilled");
      if (!bVar4) goto LAB_005311fb;
      *puVar7 = 0;
      pLVar10 = *ppLVar8;
    }
    bVar4 = pLVar10->end < uVar12;
    BVar14.word = _unit.word;
    uVar12 = pLVar10->end;
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16e,"(lifetime->end >= lastend)","lifetime->end >= lastend");
      if (!bVar4) goto LAB_005311fb;
      *puVar7 = 0;
      uVar12 = (*ppLVar8)->end;
      BVar14 = _unit;
    }
  }
  this_00 = (BVUnitT<unsigned_long> *)(bv.word + 0x20);
  pSVar9 = *(SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> **)(bv.word + 0x20);
  if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_50.word != pSVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x174,"(bv.Equal(this->activeRegs))","bv.Equal(this->activeRegs)");
    if (!bVar4) goto LAB_005311fb;
    *puVar7 = 0;
    pSVar9 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)this_00->word;
  }
  iVar13 = 0;
  iVar15 = 0;
  local_40.word = (Type)pSVar9;
  while ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word !=
         (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    lVar2 = 0;
    if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word !=
        (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      for (; (local_40.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    BVUnitT<unsigned_long>::Clear(&stack0xffffffffffffffc0,(BVIndex)lVar2);
    bVar4 = IRType_IsFloat(RegTypes[lVar2]);
    iVar13 = iVar13 + (uint)bVar4;
    iVar15 = iVar15 + (uint)!bVar4;
  }
  if (iVar15 != *(int *)(bv.word + 0x88)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x183,"(ints == this->intRegUsedCount)","ints == this->intRegUsedCount");
    if (!bVar4) goto LAB_005311fb;
    *puVar7 = 0;
  }
  if (iVar13 != *(int *)(bv.word + 0x8c)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x184,"(floats == this->floatRegUsedCount)",
                       "floats == this->floatRegUsedCount");
    if (!bVar4) goto LAB_005311fb;
    *puVar7 = 0;
    iVar13 = *(int *)(bv.word + 0x8c);
  }
  iVar15 = *(int *)(bv.word + 0x88);
  BVar6 = BVUnitT<unsigned_long>::Count(this_00);
  if (iVar13 + iVar15 != BVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x185,
                       "((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count())"
                       ,
                       "(this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count()"
                      );
    if (!bVar4) goto LAB_005311fb;
    *puVar7 = 0;
  }
  local_50.word = 0;
  local_40.word = *(ulong *)(bv.word + 0x298);
  uVar12 = 0;
  _unit.word = local_40.word;
  while( true ) {
    do {
      if (_unit.word == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_005311fb;
        *puVar7 = 0;
      }
      BVar14.word = bv.word;
      if (*(SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> **)_unit.word ==
          (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word) {
        if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_50.word !=
            *(SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> **)(bv.word + 0x290)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x19a,"(bv.Equal(this->opHelperSpilledRegs))",
                             "bv.Equal(this->opHelperSpilledRegs)");
          if (!bVar4) goto LAB_005311fb;
          *puVar7 = 0;
        }
        uVar16 = 0;
        do {
          if (uVar16 == 0x21) {
            local_40.word = *(ulong *)(BVar14.word + 0x68);
            lVar2 = 0;
            if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word !=
                (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              for (; (local_40.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            index = -(uint)((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word ==
                           (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) |
                    (uint)lVar2;
            do {
              if (index == 0xffffffff) {
                return;
              }
              BVUnitT<unsigned_long>::Clear(&stack0xffffffffffffffc0,index);
              puVar1 = *(undefined8 **)(BVar14.word + 0x3a8 + (ulong)index * 8);
              if (puVar1 == (undefined8 *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0x1a7,"(lifetime)","lifetime");
                if (!bVar4) goto LAB_005311fb;
                *puVar7 = 0;
              }
              BVar14.word = bv.word;
              this_01 = (StackSym *)*puVar1;
              if ((*(byte *)((long)puVar1 + 0x9d) & 2) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0x1a9,"(lifetime->isSecondChanceAllocated)",
                                   "lifetime->isSecondChanceAllocated");
                if (!bVar4) goto LAB_005311fb;
                *puVar7 = 0;
              }
              bVar4 = StackSym::IsConst(this_01);
              if ((!bVar4) && ((this_01->field_0x19 & 0x10) == 0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                   ,0x1aa,"(sym->IsConst() || sym->IsAllocated())",
                                   "sym->IsConst() || sym->IsAllocated()");
                if (!bVar4) goto LAB_005311fb;
                *puVar7 = 0;
              }
              lVar2 = 0;
              if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word !=
                  (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                for (; (local_40.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              index = -(uint)((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_40.word
                             == (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) |
                      (uint)lVar2;
            } while( true );
          }
          BVar5 = BVUnitT<unsigned_long>::Test
                            ((BVUnitT<unsigned_long> *)(BVar14.word + 0x58),(BVIndex)uVar16);
          if ((BVar5 != '\0') &&
             (uVar16 != *(byte *)(*(long *)(BVar14.word + 0x2a0 + uVar16 * 8) + 0x94))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1a0,"(this->tempRegLifetimes[i]->reg == i)",
                               "this->tempRegLifetimes[i]->reg == i");
            if (!bVar4) goto LAB_005311fb;
            *puVar7 = 0;
          }
          uVar16 = uVar16 + 1;
        } while( true );
      }
      _unit.word = (Type)*(SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> **)_unit.word;
      ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&stack0xffffffffffffffc0);
      BVar5 = BVUnitT<unsigned_long>::Test(&local_50,(uint)(*ppLVar8)->reg);
      if (BVar5 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x18d,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
        if (!bVar4) goto LAB_005311fb;
        *puVar7 = 0;
      }
      pLVar10 = *ppLVar8;
      if ((pLVar10->field_0x9c & 0x40) == 0) {
        BVUnitT<unsigned_long>::Set(&local_50,(uint)pLVar10->reg);
        pLVar10 = *ppLVar8;
        uVar11 = *(ushort *)&pLVar10->field_0x9c;
        if ((uVar11 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x191,"(lifetime->isOpHelperSpilled)","lifetime->isOpHelperSpilled");
          if (!bVar4) goto LAB_005311fb;
          *puVar7 = 0;
          pLVar10 = *ppLVar8;
          uVar11 = *(ushort *)&pLVar10->field_0x9c;
        }
        if ((uVar11 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x192,"(!lifetime->isSpilled)","!lifetime->isSpilled");
          if (!bVar4) goto LAB_005311fb;
          *puVar7 = 0;
          pLVar10 = *ppLVar8;
        }
      }
      bVar4 = uVar12 <= pLVar10->end;
      uVar12 = pLVar10->end;
    } while (bVar4);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x194,"(lifetime->end >= lastend)","lifetime->end >= lastend");
    if (!bVar4) break;
    *puVar7 = 0;
    uVar12 = (*ppLVar8)->end;
  }
LAB_005311fb:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
LinearScan::CheckInvariants() const
{
    BitVector bv = this->nonAllocatableRegs;
    uint32 lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->activeLiveranges)
    {
        // Make sure there are only one lifetime per reg
        Assert(!bv.Test(lifetime->reg));
        bv.Set(lifetime->reg);
        Assert(!lifetime->isOpHelperSpilled);
        Assert(!lifetime->isSpilled);
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the active reg bit vector is correct
    Assert(bv.Equal(this->activeRegs));

    uint ints = 0, floats = 0;
    FOREACH_BITSET_IN_UNITBV(index, this->activeRegs, BitVector)
    {
        if (IRType_IsFloat(RegTypes[index]))
        {
            floats++;
        }
        else
        {
            ints++;
        }
    }
    NEXT_BITSET_IN_UNITBV;
    Assert(ints == this->intRegUsedCount);
    Assert(floats == this->floatRegUsedCount);
    Assert((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count());

    bv.ClearAll();

    lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
    {
        // Make sure there are only one lifetime per reg in the op helper spilled liveranges
        Assert(!bv.Test(lifetime->reg));
        if (!lifetime->cantOpHelperSpill)
        {
            bv.Set(lifetime->reg);
            Assert(lifetime->isOpHelperSpilled);
            Assert(!lifetime->isSpilled);
        }
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the opHelperSpilledRegs bit vector is correct
    Assert(bv.Equal(this->opHelperSpilledRegs));

    for (int i = 0; i < RegNumCount; i++)
    {
        if (this->tempRegs.Test(i))
        {
            Assert(this->tempRegLifetimes[i]->reg == i);
        }
    }

    FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
    {
        Lifetime *lifetime = this->regContent[reg];
        Assert(lifetime);
        StackSym *sym = lifetime->sym;
        Assert(lifetime->isSecondChanceAllocated);
        Assert(sym->IsConst() || sym->IsAllocated());  // Should have been spilled already.
    } NEXT_BITSET_IN_UNITBV;

}